

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# active_interactor.cc
# Opt level: O0

int recvall(int s,char *buf,int n)

{
  ssize_t sVar1;
  int in_EDX;
  void *in_RSI;
  int in_EDI;
  int ret;
  int total;
  int local_1c;
  int local_18;
  
  local_18 = 0;
  sVar1 = recv(in_EDI,in_RSI,(long)in_EDX,0);
  local_1c = (int)sVar1;
  while ((0 < local_1c && local_18 < in_EDX &&
         (local_18 = local_1c + local_18, *(char *)((long)in_RSI + (long)(local_18 + -1)) != '\n')))
  {
    sVar1 = recv(in_EDI,(void *)((long)in_RSI + (long)local_18),(long)in_EDX,0);
    local_1c = (int)sVar1;
  }
  return local_18;
}

Assistant:

int recvall(int s, char* buf, int n)
{
  int total = 0;
  int ret = recv(s, buf, n, 0);
  while (ret > 0 && total < n)
  {
    total += ret;
    if (buf[total - 1] == '\n')
      break;
    ret = recv(s, buf + total, n, 0);
  }
  return total;
}